

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

GCPtr<symbols::Object> __thiscall evaluator::Evaluator::Eval(Evaluator *this,Node *node,Env *env)

{
  undefined8 uVar1;
  _List_node_base *p_Var2;
  GCPtr<symbols::Object> GVar3;
  int iVar4;
  BlockStmt *block;
  long lVar5;
  ForRangeStmt *for_stmt;
  Env *env_00;
  InitStmt *stmt;
  DeclareStmt *stmt_00;
  FunctionStmt *stmt_01;
  FunctionObject *this_00;
  Identifier *ident;
  Object *pOVar6;
  BuiltinFunction *function;
  Assign *expr;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar7;
  ulong uVar8;
  vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *this_01;
  GCPtr<symbols::Object> *this_02;
  GCPtr<symbols::Object> value;
  undefined1 local_98 [8];
  vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> local_90;
  GCPtr<symbols::Object> local_78;
  GCPtr<symbols::Object> local_70;
  pointer local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> local_48;
  
  this_01 = (vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)local_98;
  this_02 = (GCPtr<symbols::Object> *)local_98;
  iVar4 = (*node->_vptr_Node[2])(node);
  while( true ) {
    if (iVar4 == 3) {
      block = (BlockStmt *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::BlockStmt::typeinfo,0);
      evalBlockStatement(this,block,env);
      return (GCPtr<symbols::Object>)this;
    }
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 == 0x15) {
      for_stmt = (ForRangeStmt *)
                 __dynamic_cast(node,&ast::Node::typeinfo,&ast::ForRangeStmt::typeinfo,0);
      evalForRangeStatement(this,for_stmt,env);
      return (GCPtr<symbols::Object>)this;
    }
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 == 0xd) {
      env_00 = (Env *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::IfStmt::typeinfo,0);
      evalIfStatement((IfStmt *)this,env_00);
      return (GCPtr<symbols::Object>)this;
    }
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 == 10) {
      lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::ReturnStmt::typeinfo,0);
      Eval((Evaluator *)&local_90,*(Node **)(lVar5 + 0x40),env);
      iVar4 = (*(code *)((_List_node_base *)
                        (local_90.
                         super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->addr)->_M_next)();
      if (iVar4 != 4) {
        pOVar6 = (Object *)operator_new(0x18);
        plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
        goto LAB_00109955;
      }
      GCPtr<symbols::Object>::GCPtr
                ((GCPtr<symbols::Object> *)this,
                 (Object *)
                 local_90.
                 super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_0010999c;
    }
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 == 0x11) {
      stmt = (InitStmt *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::InitStmt::typeinfo,0);
      evalInitStatement(this,stmt,env);
      return (GCPtr<symbols::Object>)this;
    }
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 == 0x14) {
      stmt_00 = (DeclareStmt *)
                __dynamic_cast(node,&ast::Node::typeinfo,&ast::DeclareStmt::typeinfo,0);
      evalDeclareStatement(this,stmt_00,env);
      return (GCPtr<symbols::Object>)this;
    }
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 == 0xf) {
      stmt_01 = (FunctionStmt *)
                __dynamic_cast(node,&ast::Node::typeinfo,&ast::FunctionStmt::typeinfo,0);
      evalFunctionStmt(this,stmt_01,env);
      return (GCPtr<symbols::Object>)this;
    }
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 == 0x12) {
      lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::RangeExpr::typeinfo,0);
      pOVar6 = (Object *)operator_new(0x18);
      pOVar6->_type = RANGETYPE;
      pOVar6->_vptr_Object = (_func_int **)&PTR_type_00124cb0;
      uVar1 = *(undefined8 *)(lVar5 + 0x40);
      *(undefined8 *)&pOVar6->field_0xc = uVar1;
      *(int *)((long)&pOVar6[1]._vptr_Object + 4) = (int)uVar1;
      goto LAB_001098b7;
    }
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 != 8) break;
    lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::ExpressionStmt::typeinfo,0);
    node = *(Node **)(lVar5 + 0x40);
    iVar4 = (*node->_vptr_Node[2])(node);
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  if (iVar4 == 0x13) {
    lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::CallExpression::typeinfo,0);
    Eval((Evaluator *)local_98,*(Node **)(lVar5 + 0x40),env);
    iVar4 = (*(code *)(*(_List_node_base **)local_98)->_M_next)();
    if (iVar4 == 4) {
      plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
      do {
        plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                 (plVar7->
                 super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
      } while ((undefined1  [8])((_List_node_base *)((long)plVar7 + 0x10))->_M_prev != local_98);
      *(int *)((long)plVar7 + 0x10U) = *(int *)((long)plVar7 + 0x10U) + -1;
      *(undefined1 (*) [8])this = local_98;
      this_01 = (vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)local_98
      ;
    }
    else {
      evalExpressions(&local_90,(vector<ast::Expr_*,_std::allocator<ast::Expr_*>_> *)(lVar5 + 0x48),
                      env);
      if (((long)local_90.
                 super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_90.
                 super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 8) &&
         (iVar4 = (**(code **)((_List_node_base *)
                              (local_90.
                               super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->addr)->_M_next)(),
         iVar4 == 4)) {
        p_Var2 = (_List_node_base *)
                 (local_90.
                  super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->addr;
        plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
        do {
          plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                   (plVar7->
                   super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
        } while (((_List_node_base *)((long)plVar7 + 0x10))->_M_prev != p_Var2);
        *(int *)((long)plVar7 + 0x10U) = *(int *)((long)plVar7 + 0x10U) + 1;
        *(_List_node_base **)this = p_Var2;
      }
      else if ((local_98 == (undefined1  [8])0x0) ||
              (function = (BuiltinFunction *)
                          __dynamic_cast(local_98,&symbols::Object::typeinfo,
                                         &symbols::BuiltinFunction::typeinfo,0),
              function == (BuiltinFunction *)0x0)) {
        applyFunction(this,(GCPtr<symbols::Object> *)local_98,&local_90);
      }
      else {
        plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
        do {
          plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                   (plVar7->
                   super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
        } while ((undefined1  [8])((_List_node_base *)((long)plVar7 + 0x10))->_M_prev != local_98);
        std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::
        remove(&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar7 + 0x10));
        applyBuiltinFunction(this,function,&local_90);
      }
      std::vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::~vector
                (&local_90);
    }
    goto LAB_00109be9;
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  if (iVar4 == 0x10) {
    lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::FunctionLiteral::typeinfo,0);
    this_00 = (FunctionObject *)operator_new(0x38);
    std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::vector
              (&local_48,
               (vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> *)(lVar5 + 0x48));
    symbols::FunctionObject::FunctionObject(this_00,&local_48,*(BlockStmt **)(lVar5 + 0x60),env);
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_00);
    if (local_48.super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return (GCPtr<symbols::Object>)this;
    }
    uVar8 = (long)local_48.super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
            (long)local_48.super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
LAB_00109cd1:
    operator_delete(local_48.
                    super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,uVar8);
    return (GCPtr<symbols::Object>)this;
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  if (iVar4 == 0xc) {
    ident = (Identifier *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::Identifier::typeinfo,0);
    pOVar6 = evalIdentifier(ident,env);
LAB_001098b7:
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar6);
    return (GCPtr<symbols::Object>)this;
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  if (iVar4 == 0xb) {
    lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::StringLiteral::typeinfo,0);
    pOVar6 = (Object *)operator_new(0x38);
    local_68 = (pointer)&local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,*(long *)(lVar5 + 0x40),
               *(long *)(lVar5 + 0x48) + *(long *)(lVar5 + 0x40));
    pOVar6->_type = STRINGTYPE;
    pOVar6->_vptr_Object = (_func_int **)&PTR_type_00124d00;
    pOVar6[1]._vptr_Object = (_func_int **)(pOVar6 + 2);
    if (local_68 == (pointer)&local_58) {
      pOVar6[2]._vptr_Object = (_func_int **)CONCAT71(uStack_57,local_58);
      *(undefined8 *)&pOVar6[2]._type = uStack_50;
    }
    else {
      pOVar6[1]._vptr_Object = (_func_int **)local_68;
      pOVar6[2]._vptr_Object = (_func_int **)CONCAT71(uStack_57,local_58);
    }
    *(undefined8 *)&pOVar6[1]._type = local_60;
    local_60 = 0;
    local_58 = 0;
    *(undefined4 *)&pOVar6[3]._vptr_Object = 0;
    local_68 = (pointer)&local_58;
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar6);
    if (local_68 == (pointer)&local_58) {
      return (GCPtr<symbols::Object>)this;
    }
    uVar8 = CONCAT71(uStack_57,local_58) + 1;
    local_48.super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_68;
    goto LAB_00109cd1;
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  if (iVar4 == 5) {
    lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::Number::typeinfo,0);
    pOVar6 = (Object *)operator_new(0x18);
    iVar4 = *(int *)(lVar5 + 0x40);
    pOVar6->_type = INTTYPE;
    pOVar6->_vptr_Object = (_func_int **)&PTR_type_00124b00;
    pOVar6[1]._vptr_Object = (_func_int **)(long)iVar4;
    goto LAB_001098b7;
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  GVar3 = NATIVE_NULL;
  if (iVar4 == 4) {
    plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               (plVar7->
               super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>)
               ._M_impl._M_node.super__List_node_base._M_next;
      if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (((_List_node_base *)((long)plVar7 + 0x10))->_M_prev !=
             (_List_node_base *)NATIVE_NULL.addr);
    *(int *)((long)plVar7 + 0x10U) = *(int *)((long)plVar7 + 0x10U) + 1;
    *(Object **)this = GVar3.addr;
    return (GCPtr<symbols::Object>)this;
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  if (iVar4 == 1) {
    lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::BooleanExpr::typeinfo,0);
    nativeBooleanObject(this,*(bool *)(lVar5 + 0x40));
    return (GCPtr<symbols::Object>)this;
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  if (iVar4 == 0x16) {
    expr = (Assign *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::Assign::typeinfo,0);
    evalAssignExpression(this,expr,env);
    return (GCPtr<symbols::Object>)this;
  }
  iVar4 = (*node->_vptr_Node[2])(node);
  if (iVar4 == 7) {
    lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::UniaryOp::typeinfo,0);
    Eval((Evaluator *)&local_90,*(Node **)(lVar5 + 0x48),env);
    iVar4 = (*(code *)((_List_node_base *)
                      (local_90.
                       super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->addr)->_M_next)();
    if (iVar4 == 4) {
      plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
      do {
        plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                 (plVar7->
                 super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
      } while (((_List_node_base *)((long)plVar7 + 0x10))->_M_prev !=
               (_List_node_base *)
               local_90.
               super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
      *(int *)((long)plVar7 + 0x10U) = *(int *)((long)plVar7 + 0x10U) + -1;
      *(pointer *)this =
           local_90.
           super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
      do {
        plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                 (plVar7->
                 super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
      } while (((_List_node_base *)((long)plVar7 + 0x10))->_M_prev !=
               (_List_node_base *)
               local_90.
               super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
      *(int *)((long)plVar7 + 0x10U) = *(int *)((long)plVar7 + 0x10U) + 1;
      local_70.addr =
           (Object *)
           local_90.
           super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      evalUniaryExpression(this,(Token *)(lVar5 + 0x10),&local_70);
      this_02 = &local_70;
LAB_00109f7c:
      GCPtr<symbols::Object>::~GCPtr(this_02);
    }
  }
  else {
    iVar4 = (*node->_vptr_Node[2])(node);
    if (iVar4 != 6) {
      pOVar6 = (Object *)0x0;
      goto LAB_001098b7;
    }
    lVar5 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::BinaryOp::typeinfo,0);
    Eval((Evaluator *)&local_90,*(Node **)(lVar5 + 0x50),env);
    iVar4 = (*(code *)((_List_node_base *)
                      (local_90.
                       super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->addr)->_M_next)();
    if (iVar4 != 4) {
      Eval((Evaluator *)local_98,*(Node **)(lVar5 + 0x48),env);
      iVar4 = (*(code *)(*(_List_node_base **)local_98)->_M_next)();
      if (iVar4 == 4) {
        plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
        do {
          plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                   (plVar7->
                   super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
        } while ((undefined1  [8])((_List_node_base *)((long)plVar7 + 0x10))->_M_prev != local_98);
        std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::
        remove(&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar7 + 0x10));
        GCPtr<symbols::Object>::GCPtr
                  ((GCPtr<symbols::Object> *)this,
                   (Object *)((_List_node_base *)((long)plVar7 + 0x10))->_M_prev);
        this_02 = (GCPtr<symbols::Object> *)local_98;
      }
      else {
        evalBinaryExpression
                  ((Evaluator *)&local_78,(Token *)(lVar5 + 0x10),
                   (GCPtr<symbols::Object> *)&local_90,(GCPtr<symbols::Object> *)local_98);
        plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
        do {
          plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                   (plVar7->
                   super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
        } while (((_List_node_base *)((long)plVar7 + 0x10))->_M_prev !=
                 (_List_node_base *)
                 local_90.
                 super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::
        remove(&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar7 + 0x10));
        plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
        do {
          plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                   (plVar7->
                   super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
        } while ((undefined1  [8])((_List_node_base *)((long)plVar7 + 0x10))->_M_prev != local_98);
        std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::
        remove(&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar7 + 0x10));
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,local_78.addr);
        GCPtr<symbols::Object>::~GCPtr(&local_78);
      }
      goto LAB_00109f7c;
    }
    plVar7 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               (plVar7->
               super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>)
               ._M_impl._M_node.super__List_node_base._M_next;
      if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (((_List_node_base *)((long)plVar7 + 0x10))->_M_prev !=
             (_List_node_base *)
             local_90.
             super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::remove
              (&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar7 + 0x10));
    GCPtr<symbols::Object>::GCPtr
              ((GCPtr<symbols::Object> *)this,
               (Object *)((_List_node_base *)((long)plVar7 + 0x10))->_M_prev);
  }
LAB_0010999c:
  this_01 = &local_90;
LAB_00109be9:
  GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)this_01);
  return (GCPtr<symbols::Object>)(Object *)this;
  while (((_List_node_base *)((long)plVar7 + 0x10))->_M_prev !=
         (_List_node_base *)
         local_90.
         super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
         _M_impl.super__Vector_impl_data._M_start) {
LAB_00109955:
    plVar7 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
             (plVar7->
             super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (plVar7 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
  }
  std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::remove
            (&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar7 + 0x10));
  p_Var2 = ((_List_node_base *)((long)plVar7 + 0x10))->_M_prev;
  pOVar6->_type = RETURNTYPE;
  pOVar6->_vptr_Object = (_func_int **)&PTR_type_00124bd8;
  pOVar6[1]._vptr_Object = (_func_int **)p_Var2;
  GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar6);
  goto LAB_0010999c;
}

Assistant:

GCPtr<Object> Evaluator::Eval(Node* node, Env* env)
{
    if (node->type() == NodeType::BlockStmtType){
        auto block = dynamic_cast<BlockStmt*>(node);
        return evalBlockStatement(block, env);
    }
    else if (node->type() == NodeType::ForStmtType){
        auto* for_stmt = dynamic_cast<ForRangeStmt*>(node);
        return evalForRangeStatement(for_stmt, env);
    }
   else if(node->type() == NodeType::IfStmtType){
       auto stmt = dynamic_cast<IfStmt*>(node);
       return evalIfStatement(stmt, env);
   }
   else if(node->type() == NodeType::ReturnStmtType){
       auto stmt = dynamic_cast<ReturnStmt*>(node);
       auto value = Eval(stmt->returnValue, env);
       if(isError(value)){
           return value.raw();
       }
       return new ReturnObject(value.unref());
   }
   else if(node->type() == NodeType::InitStmtType){
       auto stmt = dynamic_cast<InitStmt*>(node);
       return evalInitStatement(stmt, env);
   }
   else if(node->type() == NodeType::DeclareStmtType){
       auto stmt = dynamic_cast<DeclareStmt*>(node);
       return evalDeclareStatement(stmt, env);
   }
   else if(node->type() == NodeType::FunctionStmtType){
       auto stmt = dynamic_cast<FunctionStmt*>(node);
       return evalFunctionStmt(stmt, env);
   }
   else if(node->type() == NodeType::RangeExprType){
        auto* expr = dynamic_cast<RangeExpr*>(node);
        return new RangeObject(expr->init_value, expr->end_value);
   }
   else if(node->type() == NodeType::ExpressionStmtType){
       auto stmt = dynamic_cast<ExpressionStmt*>(node);
       return Eval(stmt->Expression, env);
   }
   else if(node->type() == NodeType::CallExprType){
       auto expr = dynamic_cast<CallExpression*>(node);
       auto function = Eval(expr->function, env);
       if(isError(function)){
           return function;
       }
       auto args = evalExpressions(expr->arguments, env);
       if(args.size() == 1 && isError(args[0])){
            return args[0];
       }
       if(auto builtin_func = dynamic_cast<BuiltinFunction*>(function.raw())){
            function.unref();
            return applyBuiltinFunction(builtin_func, args);
       }
       return applyFunction(function, args);
   }
   else if(node->type() == NodeType::FunctionExprType){
       auto func = dynamic_cast<FunctionLiteral*>(node);
       return new FunctionObject(func->parameters, func->body, env);
   }
   else if(node->type() == NodeType::IdentifierType){
       auto ident = dynamic_cast<Identifier*>(node);
       return evalIdentifier(ident, env);
   }
   else if(node->type() == NodeType::StringLiteralType){
       auto literal = dynamic_cast<StringLiteral*>(node);
       return new StringObject(literal->Literal);
   }
   else if(node->type() == NodeType::NumberType){
       auto num = dynamic_cast<Number*>(node);
       return new IntObject(num->value);
   }
   else if(node->type() == NodeType::NullType){
       return NATIVE_NULL;
   }
   else if(node->type() == NodeType::BooleanType){
       auto expr = dynamic_cast<BooleanExpr*>(node);
       return nativeBooleanObject(expr->value);
   }
   else if(node->type() == NodeType::AssignStmtType){
        auto* expr = dynamic_cast<Assign*>(node);
        return evalAssignExpression(expr, env);
   }
   else if(node->type() == NodeType::UniaryOpType){
       auto Op = dynamic_cast<UniaryOp*>(node);
       auto RightValue = Eval(Op->RightOp, env);
       if(isError(RightValue)){
           return RightValue;
       }
       return evalUniaryExpression(Op->tok, RightValue);
   }else if(node->type() == NodeType::BinaryOpType){
       auto Op = dynamic_cast<BinaryOp*>(node);
       auto LeftValue = Eval(Op->LeftOp, env);
       if(isError(LeftValue)){
           return LeftValue.unref();
       }
       auto RightValue = Eval(Op->RightOp, env);
       if(isError(RightValue)){
           return RightValue.unref();
       }
       auto value = evalBinaryExpression(Op->tok, LeftValue, RightValue);
       LeftValue.unref();
       RightValue.unref();
       return value.raw();
   }
   return nullptr;
}